

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction
          (ConversionStream *this,Char *FuncName,bool *bTakesInputPatch)

{
  TokenListType *pTVar1;
  StorageQualifier SVar2;
  int iVar3;
  pointer pcVar4;
  size_type sVar5;
  ShaderParameterInfo *pSVar6;
  HLSL2GLSLConverterImpl *pHVar7;
  undefined8 this_00;
  iterator __position;
  int iVar8;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var9;
  size_t sVar10;
  ostream *poVar11;
  ShaderParameterInfo *pSVar12;
  __node_base_ptr p_Var13;
  int iVar14;
  char (*in_RCX) [32];
  char (*pacVar15) [32];
  uint uVar16;
  long lVar17;
  ConversionStream *pCVar18;
  char *pcVar19;
  ulong uVar20;
  char cVar21;
  _Alloc_hider _Var22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  char *SubstituteInstName;
  _Hash_node_base *p_Var23;
  char *__end;
  pointer pSVar24;
  bool bVar25;
  bool bIsVoid;
  iterator Token;
  iterator FirstStatementToken;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  String Prologue;
  string msg_1;
  iterator EntryPointToken;
  char *EntryPoint;
  iterator ArgsListEndToken;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  Params;
  stringstream PrologueSS;
  stringstream ReturnHandlerSS;
  char local_522;
  bool local_521;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_520;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_518;
  iterator iStack_510;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *local_508;
  String local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d0;
  long local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  ConversionStream *local_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_498 [9];
  undefined7 uStack_48f;
  undefined8 uStack_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_450;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  undefined1 local_420 [16];
  pointer local_410;
  char local_408;
  char acStack_407 [7];
  pointer pSStack_400;
  bool *local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  iterator local_3d0;
  char *local_3c8;
  size_type local_3c0;
  char local_3b8;
  undefined7 uStack_3b7;
  undefined8 uStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  char *local_388;
  size_type local_380;
  char local_378;
  undefined7 uStack_377;
  undefined8 uStack_370;
  pointer local_368;
  Char *local_360;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  local_358;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base aiStack_138 [264];
  
  pTVar1 = &this->m_Tokens;
  local_520._M_node =
       (this->m_Tokens).
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar3 = *(int *)&local_520._M_node[1]._M_next;
  bVar25 = iVar3 == 0x133;
  if (bVar25) {
    local_520._M_node =
         (((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            *)&(local_520._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  }
  pacVar15 = (char (*) [32])(ulong)bVar25;
  _Var9._M_node = (_List_node_base *)pTVar1;
  uVar16 = (uint)bVar25;
  local_4b0 = this;
  local_448._M_node = (_List_node_base *)pTVar1;
  local_3f8 = bTakesInputPatch;
  local_360 = FuncName;
  if (local_520._M_node != (_List_node_base *)pTVar1) {
    do {
      _Var9._M_node = local_520._M_node;
      iVar8 = *(int *)&local_520._M_node[1]._M_next;
      iVar14 = (int)pacVar15;
      if (iVar8 == 0x134) {
        uVar16 = iVar14 - 1;
        pacVar15 = (char (*) [32])(ulong)uVar16;
        in_RCX = pacVar15;
        if (iVar14 <= (int)(uint)bVar25) goto LAB_001fca25;
      }
      else if (iVar8 == 0x133) {
        pacVar15 = (char (*) [32])(ulong)(iVar14 + 1);
      }
      else if ((iVar14 == 0) && (iVar8 == 0x13b)) {
        iVar8 = std::__cxx11::string::compare((char *)&local_520._M_node[1]._M_prev);
        pacVar15 = (char (*) [32])0x0;
        if (iVar8 == 0) {
          local_520._M_node = (_List_node_base *)pTVar1;
          local_448._M_node = _Var9._M_node;
          if (iVar3 != 0x133) goto LAB_001fcbde;
          goto LAB_001fca3a;
        }
      }
      local_520._M_node =
           (((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)&(_Var9._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (local_520._M_node != (_List_node_base *)pTVar1);
    _Var9._M_node = (_List_node_base *)pTVar1;
    in_RCX = pacVar15;
    uVar16 = (uint)pacVar15;
  }
LAB_001fca25:
  if (iVar3 == 0x133) {
    if (_Var9._M_node == (_List_node_base *)pTVar1) {
LAB_001fca3a:
      FormatString<char[38]>
                ((string *)local_340,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)local_1b8,local_4b0,&local_520,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
      in_RCX = (char (*) [32])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,in_R8,(char (*) [2])0x341003,(String *)local_1b8);
      if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                        local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
    }
    if (*(int *)&local_520._M_node[1]._M_next == 0x134) goto LAB_001fcbde;
    FormatString<char[26],char[32]>
              ((string *)local_340,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",in_RCX);
    DebugAssertionFailed
              ((Char *)local_340._0_8_,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  else {
    if (uVar16 == 0) goto LAB_001fcbde;
    FormatString<char[20]>((string *)local_340,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)local_1b8,local_4b0,&local_520,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,in_R8,(char (*) [2])0x341003,(String *)local_1b8);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                      local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
LAB_001fcbde:
  if (local_448._M_node == (_List_node_base *)pTVar1) {
    local_1b8[0] = (stringstream)0x22;
    FormatString<char[47],char_const*,char>
              ((string *)local_340,(Diligent *)"Unable to find hull shader constant function \"",
               (char (*) [47])&local_360,(char **)local_1b8,(char *)in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)local_1b8,local_4b0,&local_448,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd3a,in_R8,(char (*) [2])0x341003,(String *)local_1b8);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                      local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  local_420._0_8_ = local_448._M_node[1]._M_prev;
  local_450._M_node = (local_448._M_node)->_M_prev;
  if (local_450._M_node ==
      (pTVar1->
      super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
      )._M_impl._M_node.super__List_node_base._M_next) {
    FormatString<char[11],std::__cxx11::string,char[21]>
              ((string *)local_340,(Diligent *)"Function \"",
               (char (*) [11])&local_448._M_node[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" misses return type",(char (*) [21])in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)local_1b8,local_4b0,&local_450,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd42,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340
               ,(char (*) [2])0x341003,(String *)local_1b8);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                      local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  local_358.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_521 = false;
  local_3d0._M_node = local_450._M_node;
  ProcessFunctionParameters(local_4b0,&local_3d0,&local_358,&local_521);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  local_460._8_8_ = pTVar1;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar11 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"#define ",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_CONST_FUNC_RETURN_",0x13);
  pcVar19 = "(_RET_VAL_)";
  if (local_521 != false) {
    pcVar19 = "";
  }
  lVar17 = 0xb;
  if (local_521 != false) {
    lVar17 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar19,lVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," {\\\n",4);
  *local_3f8 = false;
  local_368 = local_358.
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_358.
      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_358.
      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar24 = local_358.
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      SVar2 = pSVar24->storageQualifier;
      if ((SVar2 == Ret) || (SVar2 == Out)) {
        local_4f8._M_dataplus._M_p = (pointer)0x0;
        local_4f8._M_string_length = 0;
        local_4f8.field_2._M_allocated_capacity = 0;
        local_508 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        local_518._M_node = (_List_node_base *)0x0;
        iStack_510._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_4a8._0_8_ = pSVar24;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_4f8,(iterator)0x0,(ShaderParameterInfo **)local_4a8);
        local_4a8._0_8_ =
             (pSVar24->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_510._M_current == local_508) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_518,iStack_510,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_4a8);
        }
        else {
          (iStack_510._M_current)->_M_current = (ShaderParameterInfo *)local_4a8._0_8_;
          iStack_510._M_current = iStack_510._M_current + 1;
        }
        if (((pSVar24->storageQualifier != Ret) && ((pSVar24->GSAttribs).PrimType == Undefined)) &&
           ((pSVar24->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),"    ",4)
          ;
          pcVar19 = (pSVar24->Type)._M_dataplus._M_p;
          if (pcVar19 == (char *)0x0) {
            std::ios::clear((int)local_340 + 0x10 +
                            (int)*(undefined8 *)(local_330[0]._M_allocated_capacity - 0x18));
          }
          else {
            sVar10 = strlen(pcVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_340 + 0x10),pcVar19,sVar10);
          }
          local_4a8[0] = 0x20;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_340 + 0x10),(char *)local_4a8,1);
          pcVar19 = (pSVar24->Name)._M_dataplus._M_p;
          if (pcVar19 == (char *)0x0) {
            std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
          }
          else {
            sVar10 = strlen(pcVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar19,sVar10);
          }
          if ((pSVar24->ArraySize)._M_string_length != 0) {
            local_4a8[0] = kw_min16float1x2;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_340 + 0x10),(char *)local_4a8,1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pSVar24->ArraySize)._M_dataplus._M_p,
                                 (pSVar24->ArraySize)._M_string_length);
            local_4a8[0] = 0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_4a8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),";\n",2);
        }
        while (local_4f8._M_dataplus._M_p != (pointer)local_4f8._M_string_length) {
          pcVar19 = *(char **)(local_4f8._M_string_length + -8);
          pSVar6 = *(ShaderParameterInfo **)(pcVar19 + 0x88);
          pSVar12 = *(ShaderParameterInfo **)(pcVar19 + 0x90);
          if (pSVar6 == pSVar12) {
            if (iStack_510._M_current[-1]._M_current != pSVar6) {
              FormatString<char[26],char[49]>
                        ((string *)local_4a8,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])pSVar6);
              DebugAssertionFailed
                        ((Char *)local_4a8._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_4a8._0_8_ != (pointer)local_498) {
                operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
              }
            }
            if (*(long *)(pcVar19 + 0x70) == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar19 + 0x48),(char (*) [2])0x358930);
            }
            local_4d0 = &local_4c0;
            local_4c8 = 0;
            local_4c0._M_local_buf[0] = '\0';
            pHVar7 = local_4b0->m_Converter;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_4a8,
                       (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (pcVar19 + 0x68))->_M_dataplus)._M_p,false);
            pCVar18 = (ConversionStream *)
                      ((local_4a8._8_8_ & 0x7fffffffffffffff) %
                      (pHVar7->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h._M_bucket_count
                      );
            p_Var13 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (&(pHVar7->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h,
                                 (size_type)pCVar18,(key_type *)local_4a8,
                                 local_4a8._8_8_ & 0x7fffffffffffffff);
            if (p_Var13 == (__node_base_ptr)0x0) {
              p_Var23 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var23 = p_Var13->_M_nxt;
            }
            if (((pointer)local_4a8._0_8_ != (pointer)0x0) && ((long)local_4a8._8_8_ < 0)) {
              operator_delete__((void *)local_4a8._0_8_);
            }
            if (p_Var23 != (_Hash_node_base *)0x0) {
              pCVar18 = (ConversionStream *)(p_Var23 + 3);
              std::__cxx11::string::_M_assign((string *)&local_4d0);
            }
            SubstituteInstName = "";
            if (*pcVar19 == '\x04') {
              SubstituteInstName = "_RET_VAL_";
            }
            BuildParameterName_abi_cxx11_
                      ((String *)local_4a8,pCVar18,
                       (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                        *)&local_4f8,'.',"",SubstituteInstName,"");
            if (local_4c8 == 0) {
              LogError<true,char[120],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
                        (false,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xd82,(char (*) [120])
                                "Supported output semantics of a hull shader constant function are \"SV_TessFactor\" and \"SV_InsideTessFactor\".\nVariable \""
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (pcVar19 + 0x48),(char (*) [18])"\" with semantic \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar19 + 0x68),(char (*) [19])"\" is not supported");
            }
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_1b8 + 0x10),local_4d0->_M_local_buf,local_4c8);
            local_522 = '(';
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,&local_522,1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)local_4a8._0_8_,local_4a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,");\\\n",4);
            if ((pointer)local_4a8._0_8_ != (pointer)local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            local_4f8._M_string_length = local_4f8._M_string_length + -8;
            iStack_510._M_current = iStack_510._M_current + -1;
            if (local_4d0 != &local_4c0) {
              operator_delete(local_4d0,
                              CONCAT71(local_4c0._M_allocated_capacity._1_7_,
                                       local_4c0._M_local_buf[0]) + 1);
            }
          }
          else {
            if (*(long *)(pcVar19 + 0x70) != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar19 + 0x48),(char (*) [2])0x358930);
              pSVar12 = *(ShaderParameterInfo **)(pcVar19 + 0x90);
            }
            pSVar6 = iStack_510._M_current[-1]._M_current;
            if (pSVar6 == pSVar12) {
              local_4f8._M_string_length = local_4f8._M_string_length + -8;
              iStack_510._M_current = iStack_510._M_current + -1;
            }
            else {
              iStack_510._M_current[-1]._M_current = pSVar6 + 1;
              if (local_4f8._M_string_length == local_4f8.field_2._M_allocated_capacity) {
                local_4a8._0_8_ = pSVar6;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)&local_4f8,(iterator)local_4f8._M_string_length,
                           (ShaderParameterInfo **)local_4a8);
              }
              else {
                *(ShaderParameterInfo **)local_4f8._M_string_length = pSVar6;
                local_4f8._M_string_length = local_4f8._M_string_length + 8;
              }
              local_4a8._0_8_ =
                   (pSVar6->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iStack_510._M_current == local_508) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_518,iStack_510,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_4a8);
              }
              else {
                (iStack_510._M_current)->_M_current = (ShaderParameterInfo *)local_4a8._0_8_;
                iStack_510._M_current = iStack_510._M_current + 1;
              }
            }
          }
        }
LAB_001fd56d:
        if (local_518._M_node != (_List_node_base *)0x0) {
          operator_delete(local_518._M_node,(long)local_508 - (long)local_518._M_node);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar20 = local_4f8.field_2._M_allocated_capacity - (long)local_4f8._M_dataplus._M_p;
          _Var22._M_p = local_4f8._M_dataplus._M_p;
LAB_001fd59e:
          operator_delete(_Var22._M_p,uVar20);
        }
      }
      else if (SVar2 == In) {
        if ((pSVar24->HSAttribs).PatchType != InputPatch) {
          local_4f8._M_dataplus._M_p = (pointer)0x0;
          local_4f8._M_string_length = 0;
          local_4f8.field_2._M_allocated_capacity = 0;
          local_508 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                       *)0x0;
          local_518._M_node = (_List_node_base *)0x0;
          iStack_510._M_current =
               (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                *)0x0;
          local_4a8._0_8_ = pSVar24;
          std::
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
          ::
          _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                    ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                      *)&local_4f8,(iterator)0x0,(ShaderParameterInfo **)local_4a8);
          local_4a8._0_8_ =
               (pSVar24->members).
               super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          if (iStack_510._M_current == local_508) {
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&local_518,iStack_510,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)local_4a8);
          }
          else {
            (iStack_510._M_current)->_M_current = (ShaderParameterInfo *)local_4a8._0_8_;
            iStack_510._M_current = iStack_510._M_current + 1;
          }
          if (((pSVar24->storageQualifier != Ret) && ((pSVar24->GSAttribs).PrimType == Undefined))
             && ((pSVar24->HSAttribs).PatchType == Undefined)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_340 + 0x10),"    ",4);
            pcVar19 = (pSVar24->Type)._M_dataplus._M_p;
            if (pcVar19 == (char *)0x0) {
              std::ios::clear((int)local_340 + 0x10 +
                              (int)*(undefined8 *)(local_330[0]._M_allocated_capacity - 0x18));
            }
            else {
              sVar10 = strlen(pcVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_340 + 0x10),pcVar19,sVar10);
            }
            local_4a8[0] = 0x20;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_340 + 0x10),(char *)local_4a8,1);
            pcVar19 = (pSVar24->Name)._M_dataplus._M_p;
            if (pcVar19 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar10 = strlen(pcVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar19,sVar10);
            }
            if ((pSVar24->ArraySize)._M_string_length != 0) {
              local_4a8[0] = kw_min16float1x2;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_340 + 0x10),(char *)local_4a8,1);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(pSVar24->ArraySize)._M_dataplus._M_p,
                                   (pSVar24->ArraySize)._M_string_length);
              local_4a8[0] = 0x5d;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_4a8,1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_340 + 0x10),";\n",2);
          }
          while (local_4f8._M_dataplus._M_p != (pointer)local_4f8._M_string_length) {
            sVar5 = *(size_type *)(local_4f8._M_string_length + -8);
            pSVar6 = *(ShaderParameterInfo **)(sVar5 + 0x88);
            pSVar12 = *(ShaderParameterInfo **)(sVar5 + 0x90);
            if (pSVar6 == pSVar12) {
              if (iStack_510._M_current[-1]._M_current != pSVar6) {
                FormatString<char[26],char[49]>
                          ((string *)local_4a8,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                           (char (*) [49])pSVar6);
                DebugAssertionFailed
                          ((Char *)local_4a8._0_8_,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb19);
                if ((pointer)local_4a8._0_8_ != (pointer)local_498) {
                  operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
                }
              }
              if (*(long *)(sVar5 + 0x70) == 0) {
                LogError<true,char[36],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (sVar5 + 0x48),(char (*) [2])0x358930);
              }
              local_4d0 = &local_4c0;
              local_4c8 = 0;
              local_4c0._M_local_buf[0] = '\0';
              pHVar7 = local_4b0->m_Converter;
              HashMapStringKey::HashMapStringKey
                        ((HashMapStringKey *)local_4a8,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (sVar5 + 0x68))->_M_dataplus)._M_p,false);
              pCVar18 = (ConversionStream *)
                        ((local_4a8._8_8_ & 0x7fffffffffffffff) %
                        (pHVar7->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[0]._M_h.
                        _M_bucket_count);
              p_Var13 = std::
                        _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    *)((pHVar7->m_HLSLSemanticToGLSLVar)._M_elems + 3),
                                   (size_type)pCVar18,(key_type *)local_4a8,
                                   local_4a8._8_8_ & 0x7fffffffffffffff);
              if (p_Var13 == (__node_base_ptr)0x0) {
                p_Var23 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var23 = p_Var13->_M_nxt;
              }
              if (((pointer)local_4a8._0_8_ != (pointer)0x0) && ((long)local_4a8._8_8_ < 0)) {
                operator_delete__((void *)local_4a8._0_8_);
              }
              if (p_Var23 != (_Hash_node_base *)0x0) {
                pCVar18 = (ConversionStream *)(p_Var23 + 3);
                std::__cxx11::string::_M_assign((string *)&local_4d0);
              }
              BuildParameterName_abi_cxx11_
                        ((String *)local_4a8,pCVar18,
                         (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          *)&local_4f8,'.',"","","");
              if (local_4c8 == 0) {
                LogError<true,char[115],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
                          (false,"operator()",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xd6f,(char (*) [115])
                                  "Supported inputs to a hull shader constant function are \"InputPatch<>\" and variables with SV_ semantic.\nVariable \""
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (sVar5 + 0x48),(char (*) [18])"\" with semantic \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (sVar5 + 0x68),(char (*) [19])"\" is not supported");
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_340 + 0x10),"    ",4);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_340 + 0x10),local_4d0->_M_local_buf,local_4c8);
              local_522 = '(';
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,&local_522,1);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_4a8._0_8_,local_4a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,");\n",3);
              if ((pointer)local_4a8._0_8_ != (pointer)local_498) {
                operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
              }
              local_4f8._M_string_length = local_4f8._M_string_length + -8;
              iStack_510._M_current = iStack_510._M_current + -1;
              if (local_4d0 != &local_4c0) {
                operator_delete(local_4d0,
                                CONCAT71(local_4c0._M_allocated_capacity._1_7_,
                                         local_4c0._M_local_buf[0]) + 1);
              }
            }
            else {
              if (*(long *)(sVar5 + 0x70) != 0) {
                LogError<true,char[35],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (sVar5 + 0x48),(char (*) [2])0x358930);
                pSVar12 = *(ShaderParameterInfo **)(sVar5 + 0x90);
              }
              pSVar6 = iStack_510._M_current[-1]._M_current;
              if (pSVar6 == pSVar12) {
                local_4f8._M_string_length = local_4f8._M_string_length + -8;
                iStack_510._M_current = iStack_510._M_current + -1;
              }
              else {
                iStack_510._M_current[-1]._M_current = pSVar6 + 1;
                if (local_4f8._M_string_length == local_4f8.field_2._M_allocated_capacity) {
                  local_4a8._0_8_ = pSVar6;
                  std::
                  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  ::
                  _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                            ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                              *)&local_4f8,(iterator)local_4f8._M_string_length,
                             (ShaderParameterInfo **)local_4a8);
                }
                else {
                  *(ShaderParameterInfo **)local_4f8._M_string_length = pSVar6;
                  local_4f8._M_string_length = local_4f8._M_string_length + 8;
                }
                local_4a8._0_8_ =
                     (pSVar6->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (iStack_510._M_current == local_508) {
                  std::
                  vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  ::
                  _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                            ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                              *)&local_518,iStack_510,
                             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                              *)local_4a8);
                }
                else {
                  (iStack_510._M_current)->_M_current = (ShaderParameterInfo *)local_4a8._0_8_;
                  iStack_510._M_current = iStack_510._M_current + 1;
                }
              }
            }
          }
          goto LAB_001fd56d;
        }
        *local_3f8 = true;
        local_4d0 = &local_4c0;
        pcVar4 = (pSVar24->Type)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4d0,pcVar4,pcVar4 + (pSVar24->Type)._M_string_length);
        this_00 = local_460._8_8_;
        cVar21 = (char)(string *)&local_4d0;
        std::__cxx11::string::push_back(cVar21);
        std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)(pSVar24->Name)._M_dataplus._M_p);
        std::__cxx11::string::push_back(cVar21);
        std::__cxx11::string::_M_append
                  ((char *)&local_4d0,(ulong)(pSVar24->ArraySize)._M_dataplus._M_p);
        std::__cxx11::string::push_back(cVar21);
        __position._M_node = local_3d0._M_node;
        std::__cxx11::string::string
                  ((string *)(local_420 + 8),local_4d0->_M_local_buf,(allocator *)&local_4f8);
        local_440._M_allocated_capacity = (size_type)&local_430;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"","");
        local_4a8._0_4_ = 0x143;
        local_4a8._8_8_ = local_498 + 8;
        local_480._M_allocated_capacity = (size_type)&local_470;
        if ((char *)local_420._8_8_ == &local_408) {
          uStack_488 = pSStack_400;
        }
        else {
          local_4a8._8_8_ = local_420._8_8_;
        }
        uStack_48f._0_1_ = acStack_407[0];
        uStack_48f._1_1_ = acStack_407[1];
        uStack_48f._2_1_ = acStack_407[2];
        uStack_48f._3_1_ = acStack_407[3];
        uStack_48f._4_1_ = acStack_407[4];
        uStack_48f._5_1_ = acStack_407[5];
        uStack_48f._6_1_ = acStack_407[6];
        local_498[8] = local_408;
        local_498._0_8_ = local_410;
        local_410 = (pointer)0x0;
        local_408 = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_allocated_capacity == &local_430) {
          local_470._8_8_ = local_430._8_8_;
        }
        else {
          local_480._M_allocated_capacity = local_440._M_allocated_capacity;
        }
        local_470._M_allocated_capacity._1_7_ = local_430._M_allocated_capacity._1_7_;
        local_470._M_local_buf[0] = local_430._M_local_buf[0];
        local_480._8_8_ = local_440._8_8_;
        local_440._8_8_ = 0;
        local_430._M_local_buf[0] = '\0';
        local_460._M_allocated_capacity = 0xffffffffffffffff;
        local_440._M_allocated_capacity = (size_type)&local_430;
        local_420._8_8_ = &local_408;
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        emplace<Diligent::Parsing::HLSLTokenInfo>
                  ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                    *)this_00,(const_iterator)__position._M_node,(HLSLTokenInfo *)local_4a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_allocated_capacity != &local_470) {
          operator_delete((void *)local_480._M_allocated_capacity,
                          local_470._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_4a8._8_8_ != local_498 + 8) {
          operator_delete((void *)local_4a8._8_8_,stack0xfffffffffffffb70 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_allocated_capacity != &local_430) {
          operator_delete((void *)local_440._M_allocated_capacity,
                          CONCAT71(local_430._M_allocated_capacity._1_7_,local_430._M_local_buf[0])
                          + 1);
        }
        if ((char *)local_420._8_8_ != &local_408) {
          operator_delete((void *)local_420._8_8_,CONCAT71(acStack_407,local_408) + 1);
        }
        if (local_4d0 == &local_4c0) goto LAB_001fd5a3;
        uVar20 = CONCAT71(local_4c0._M_allocated_capacity._1_7_,local_4c0._M_local_buf[0]) + 1;
        _Var22._M_p = (pointer)local_4d0;
        goto LAB_001fd59e;
      }
LAB_001fd5a3:
      pSVar24 = pSVar24 + 1;
    } while (pSVar24 != local_368);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"return;}\n",9);
  _Var9._M_node = local_450._M_node;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_388,local_4d0->_M_local_buf,(allocator *)&local_4f8)
  ;
  std::__cxx11::string::string
            ((string *)&local_3a8,(char *)local_450._M_node[3]._M_prev,(allocator *)&local_518);
  pcVar19 = local_498 + 8;
  local_4a8._0_4_ = 0x143;
  if (local_388 == &local_378) {
    uStack_488 = uStack_370;
    local_4a8._8_8_ = pcVar19;
  }
  else {
    local_4a8._8_8_ = local_388;
  }
  uStack_48f = (char  [7])uStack_377;
  local_498[8] = local_378;
  local_498._0_8_ = local_380;
  local_380 = 0;
  local_378 = '\0';
  if (local_3a8 == &local_398) {
    local_470._8_8_ = local_398._8_8_;
    local_480._M_allocated_capacity = (size_type)&local_470;
  }
  else {
    local_480._M_allocated_capacity = (size_type)local_3a8;
  }
  local_470._M_allocated_capacity._1_7_ = local_398._M_allocated_capacity._1_7_;
  local_470._M_local_buf[0] = local_398._M_local_buf[0];
  local_480._8_8_ = local_3a0;
  local_3a0 = 0;
  local_398._M_local_buf[0] = '\0';
  local_460._M_allocated_capacity = 0xffffffffffffffff;
  local_3a8 = &local_398;
  local_388 = &local_378;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)local_460._8_8_,(const_iterator)_Var9._M_node,(HLSLTokenInfo *)local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_allocated_capacity != &local_470) {
    operator_delete((void *)local_480._M_allocated_capacity,local_470._M_allocated_capacity + 1);
  }
  if ((char *)local_4a8._8_8_ != pcVar19) {
    operator_delete((void *)local_4a8._8_8_,stack0xfffffffffffffb70 + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,
                    CONCAT71(local_398._M_allocated_capacity._1_7_,local_398._M_local_buf[0]) + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,
                    CONCAT71(local_4c0._M_allocated_capacity._1_7_,local_4c0._M_local_buf[0]) + 1);
  }
  Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::_M_replace
            ((ulong)&local_450._M_node[3]._M_prev,0,(char *)local_450._M_node[4]._M_next,0x341003);
  std::__cxx11::stringbuf::str();
  local_520._M_node = (local_3d0._M_node)->_M_next;
  if (local_520._M_node == (_List_node_base *)local_460._8_8_) {
    FormatString<char[55],char_const*,char[3]>
              ((string *)local_4a8,
               (Diligent *)"Unexpected end of file while looking for the body of \"",
               (char (*) [55])local_420,(char **)0x358809,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_4f8,local_4b0,&local_520,4);
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd93,Args,(char (*) [2])0x341003,&local_4f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_498) {
      operator_delete((void *)local_4a8._0_8_,local_498._0_8_ + 1);
    }
  }
  if (*(int *)&local_520._M_node[1]._M_next != 0x133) {
    FormatString<char[13]>((string *)local_4a8,(char (*) [13])"\'{\' expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_4f8,local_4b0,&local_520,4);
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd94,Args,(char (*) [2])0x341003,&local_4f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_498) {
      operator_delete((void *)local_4a8._0_8_,local_498._0_8_ + 1);
    }
  }
  local_518._M_node = (local_520._M_node)->_M_next;
  if (local_518._M_node == (_List_node_base *)local_460._8_8_) {
    FormatString<char[55],char_const*,char[3]>
              ((string *)local_4a8,
               (Diligent *)"Unexpected end of file while looking for the body of \"",
               (char (*) [55])local_420,(char **)0x358809,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_4f8,local_4b0,&local_518,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd9c,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8
               ,(char (*) [2])0x341003,&local_4f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4a8._0_8_ != local_498) {
      operator_delete((void *)local_4a8._0_8_,local_498._0_8_ + 1);
    }
  }
  _Var9._M_node = local_518._M_node;
  std::__cxx11::string::string((string *)&local_3c8,local_4d0->_M_local_buf,(allocator *)&local_4f8)
  ;
  local_3f0 = &local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"\n","");
  local_4a8._0_4_ = TextBlock;
  if (local_3c8 == &local_3b8) {
    uStack_488 = uStack_3b0;
    local_4a8._8_8_ = pcVar19;
  }
  else {
    local_4a8._8_8_ = local_3c8;
  }
  uStack_48f = (char  [7])uStack_3b7;
  local_498[8] = local_3b8;
  local_498._0_8_ = local_3c0;
  local_3c0 = 0;
  local_3b8 = '\0';
  if (local_3f0 == &local_3e0) {
    local_470._8_8_ = local_3e0._8_8_;
    local_480._M_allocated_capacity = (size_type)&local_470;
  }
  else {
    local_480._M_allocated_capacity = (size_type)local_3f0;
  }
  local_470._M_allocated_capacity._1_7_ = local_3e0._M_allocated_capacity._1_7_;
  local_470._M_local_buf[0] = local_3e0._M_local_buf[0];
  local_480._8_8_ = local_3e8;
  local_3e8 = 0;
  local_3e0._M_local_buf[0] = '\0';
  local_460._M_allocated_capacity = 0xffffffffffffffff;
  local_3f0 = &local_3e0;
  local_3c8 = &local_3b8;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)local_460._8_8_,(const_iterator)_Var9._M_node,(HLSLTokenInfo *)local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_allocated_capacity != &local_470) {
    operator_delete((void *)local_480._M_allocated_capacity,local_470._M_allocated_capacity + 1);
  }
  if ((char *)local_4a8._8_8_ != pcVar19) {
    operator_delete((void *)local_4a8._8_8_,stack0xfffffffffffffb70 + 1);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,
                    CONCAT71(local_3e0._M_allocated_capacity._1_7_,local_3e0._M_local_buf[0]) + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,CONCAT71(uStack_3b7,local_3b8) + 1);
  }
  ProcessReturnStatements
            (local_4b0,&local_520,local_521,(Char *)local_420._0_8_,"_CONST_FUNC_RETURN_");
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,
                    CONCAT71(local_4c0._M_allocated_capacity._1_7_,local_4c0._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::~vector(&local_358);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(const Char* FuncName, bool& bTakesInputPatch)
{
    // Search for the function in the global scope
    auto EntryPointToken = m_Tokens.end();
    auto Token           = m_Tokens.begin();
    ProcessScope(
        Token, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& tkn, int ScopeDepth) //
        {
            if (ScopeDepth == 0 && tkn->Type == TokenType::Identifier && tkn->Literal == FuncName)
            {
                EntryPointToken = tkn;
                tkn             = m_Tokens.end();
            }
            else
                ++tkn;
        } //
    );
    VERIFY_PARSER_STATE(EntryPointToken, EntryPointToken != m_Tokens.end(), "Unable to find hull shader constant function \"", FuncName, '\"');
    const auto* EntryPoint = EntryPointToken->Literal.c_str();

    auto TypeToken = EntryPointToken;
    --TypeToken;
    // void ConstantHS( InputPatch<VSOutput, 1> p,
    // ^
    // TypeToken
    VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.begin(), "Function \"", EntryPointToken->Literal, "\" misses return type");

    std::vector<ShaderParameterInfo> Params;

    auto ArgsListEndToken = TypeToken;
    bool bIsVoid          = false;
    ProcessFunctionParameters(ArgsListEndToken, Params, bIsVoid);
    // HS_CONSTANT_DATA_OUTPUT ConstantHS( InputPatch<VSOutput, 1> p,
    //                                     uint BlockID : SV_PrimitiveID)
    //                                                                  ^
    //                                                       ArgsListEndToken

    std::stringstream PrologueSS, ReturnHandlerSS;
    const Char*       ReturnMacroName = "_CONST_FUNC_RETURN_";
    // Some GLES compilers cannot properly handle macros with empty argument lists, such as _CONST_FUNC_RETURN_().
    // Also, some compilers generate an error if there is no whitespace after the macro without arguments: _CONST_FUNC_RETURN_{
    ReturnHandlerSS << "#define " << ReturnMacroName << (bIsVoid ? "" : "(_RET_VAL_)") << " {\\\n";

    bTakesInputPatch = false;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            if (TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::InputPatch)
            {
                bTakesInputPatch = true;
                String Argument(TopLevelParam.Type);
                Argument.push_back(' ');
                Argument.append(TopLevelParam.Name);
                Argument.push_back('[');
                Argument.append(TopLevelParam.ArraySize);
                Argument.push_back(']');
                m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, Argument.c_str()));
            }
            else
            {
                ProcessShaderArgument(
                    TopLevelParam, HSInd, InVar, PrologueSS,
                    [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                    {
                        String FullIndexedParamName = BuildParameterName(MemberStack, '.');
                        if (Getter.empty())
                        {
                            LOG_ERROR_AND_THROW("Supported inputs to a hull shader constant function are \"InputPatch<>\" and variables with SV_ semantic.\n"
                                                "Variable \"",
                                                Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                        }
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                    } //
                );
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, HSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (Setter.empty())
                    {
                        LOG_ERROR_AND_THROW("Supported output semantics of a hull shader constant function are \"SV_TessFactor\" and \"SV_InsideTessFactor\".\n"
                                            "Variable \"",
                                            Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                    }

                    // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                    // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                    ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                } //
            );
        }
    }
    ReturnHandlerSS << "return;}\n";
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, ReturnHandlerSS.str().c_str(), TypeToken->Delimiter.c_str()));
    TypeToken->Delimiter = "\n";

    String Prologue = PrologueSS.str();
    Token           = ArgsListEndToken;
    ++Token;
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenBrace, "\'{\' expected");

    auto FirstStatementToken = Token;
    ++FirstStatementToken;
    // void main ()
    // {
    //      int a;
    //      ^
    VERIFY_PARSER_STATE(FirstStatementToken, FirstStatementToken != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");

    // Insert prologue before the first token
    m_Tokens.insert(FirstStatementToken, TokenInfo(TokenType::TextBlock, Prologue.c_str(), "\n"));

    ProcessReturnStatements(Token, bIsVoid, EntryPoint, ReturnMacroName);
}